

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O1

void __thiscall Pl_PNGFilter::decodePaeth(Pl_PNGFilter *this)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  
  if (this->bytes_per_row != 0) {
    puVar4 = this->cur_row;
    puVar5 = this->prev_row;
    uVar3 = this->bytes_per_pixel;
    uVar8 = 0;
    do {
      uVar10 = 0;
      uVar11 = 0;
      if (uVar3 <= uVar8) {
        uVar12 = (ulong)((int)uVar8 - uVar3);
        uVar10 = (uint)puVar4[uVar12 + 1];
        uVar11 = (uint)puVar5[uVar12 + 1];
      }
      bVar2 = puVar5[uVar8 + 1];
      iVar14 = (uVar10 + bVar2) - uVar11;
      uVar7 = iVar14 - uVar10;
      uVar6 = -uVar7;
      if (0 < (int)uVar7) {
        uVar6 = uVar7;
      }
      uVar13 = iVar14 - (uint)bVar2;
      uVar7 = -uVar13;
      if (0 < (int)uVar13) {
        uVar7 = uVar13;
      }
      uVar15 = iVar14 - uVar11;
      uVar13 = -uVar15;
      if (0 < (int)uVar15) {
        uVar13 = uVar15;
      }
      if (uVar7 <= uVar13) {
        uVar11 = (uint)bVar2;
      }
      if (uVar13 < uVar6) {
        uVar10 = uVar11;
      }
      cVar9 = (char)uVar10;
      if (uVar7 < uVar6) {
        cVar9 = (char)uVar11;
      }
      puVar1 = puVar4 + uVar8 + 1;
      *puVar1 = *puVar1 + cVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->bytes_per_row);
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodePaeth()
{
    QTC::TC("libtests", "Pl_PNGFilter decodePaeth");
    unsigned char* buffer = this->cur_row + 1;
    unsigned char* above_buffer = this->prev_row + 1;
    unsigned int bpp = this->bytes_per_pixel;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        int left = 0;
        int up = above_buffer[i];
        int upper_left = 0;

        if (i >= bpp) {
            left = buffer[i - bpp];
            upper_left = above_buffer[i - bpp];
        }

        buffer[i] =
            static_cast<unsigned char>(buffer[i] + this->PaethPredictor(left, up, upper_left));
    }
}